

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathExtras.h
# Opt level: O0

unsigned_long llvm::findLastSet<unsigned_long>(unsigned_long Val,ZeroBehavior ZB)

{
  size_t sVar1;
  ZeroBehavior ZB_local;
  unsigned_long Val_local;
  
  if ((ZB == ZB_Max) && (Val == 0)) {
    Val_local = std::numeric_limits<unsigned_long>::max();
  }
  else {
    sVar1 = countLeadingZeros<unsigned_long>(Val,ZB_Undefined);
    Val_local = sVar1 ^ 0x3f;
  }
  return Val_local;
}

Assistant:

T findLastSet(T Val, ZeroBehavior ZB = ZB_Max) {
  if (ZB == ZB_Max && Val == 0)
    return std::numeric_limits<T>::max();

  // Use ^ instead of - because both gcc and llvm can remove the associated ^
  // in the __builtin_clz intrinsic on x86.
  return countLeadingZeros(Val, ZB_Undefined) ^
         (std::numeric_limits<T>::digits - 1);
}